

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ImDrawVert *pIVar3;
  long lVar4;
  long lVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ImVec2 *pIVar14;
  long lVar15;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_90;
  float local_88 [4];
  ulong local_78;
  ulong local_70;
  ImVec2 local_68;
  ulong local_60;
  uint *local_58;
  ulong local_50;
  ImU32 local_44;
  ImU32 local_40;
  int local_3c;
  ImVec2 *local_38;
  
  if (2 < points_count) {
    uVar12 = (ulong)(uint)points_count;
    IVar17 = this->_Data->TexUvWhitePixel;
    local_38 = points;
    if ((this->Flags & 2) == 0) {
      uStack_90 = 0x16ea18;
      PrimReserve(this,points_count * 3 + -6,points_count);
      uVar8 = 0;
      do {
        this->_VtxWritePtr->pos = local_38[uVar8];
        this->_VtxWritePtr->uv = IVar17;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = col;
        this->_VtxWritePtr = pIVar3 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
      puVar6 = this->_IdxWritePtr;
      iVar7 = 3;
      if (3 < points_count) {
        iVar7 = points_count;
      }
      iVar9 = 2;
      do {
        *puVar6 = this->_VtxCurrentIdx;
        puVar6[1] = (this->_VtxCurrentIdx + iVar9) - 1;
        puVar6[2] = this->_VtxCurrentIdx + iVar9;
        puVar6 = puVar6 + 3;
        iVar9 = iVar9 + 1;
      } while (iVar7 != iVar9);
      this->_IdxWritePtr = puVar6;
      local_58 = &this->_VtxCurrentIdx;
    }
    else {
      local_40 = col & 0xffffff;
      local_3c = points_count * 2;
      uStack_90 = 0x16eabb;
      local_68 = IVar17;
      local_44 = col;
      PrimReserve(this,points_count * 9 + -6,local_3c);
      local_58 = &this->_VtxCurrentIdx;
      uVar11 = this->_VtxCurrentIdx;
      puVar6 = this->_IdxWritePtr;
      iVar7 = points_count + -2;
      uVar10 = uVar11 + 2;
      do {
        *puVar6 = uVar11;
        puVar6[1] = uVar10;
        uVar10 = uVar10 + 2;
        puVar6[2] = uVar10;
        puVar6 = puVar6 + 3;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      local_50 = (ulong)uVar11;
      this->_IdxWritePtr = puVar6;
      lVar4 = -(uVar12 * 8 + 0xf & 0xfffffffffffffff0);
      lVar5 = lVar4 + -0x88;
      iVar7 = points_count + -1;
      local_60 = uVar12;
      uVar12 = 1;
      if (1 < points_count) {
        uVar12 = (ulong)(uint)points_count;
      }
      uVar8 = 0;
      local_78 = (ulong)(uVar11 + 1);
      local_70 = uVar12;
      pIVar14 = local_38;
      iVar9 = iVar7;
      do {
        lVar15 = (long)iVar9;
        local_88[0] = pIVar14[uVar8].x - pIVar14[lVar15].x;
        local_88[1] = pIVar14[uVar8].y - pIVar14[lVar15].y;
        fVar16 = local_88[0] * local_88[0] + local_88[1] * local_88[1];
        if (0.0 < fVar16) {
          if (fVar16 < 0.0) {
            local_88[2] = 0.0;
            local_88[3] = 0.0;
            *(undefined8 *)((long)&uStack_90 + lVar4) = 0x16eb7d;
            fVar16 = sqrtf(fVar16);
            uVar12 = local_70;
            pIVar14 = local_38;
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          local_88[0] = local_88[0] * (1.0 / fVar16);
          local_88[1] = local_88[1] * (1.0 / fVar16);
        }
        *(float *)((long)local_88 + lVar15 * 8 + lVar5 + 0x88) = local_88[1];
        *(float *)((long)local_88 + lVar15 * 8 + lVar4 + 4) = -local_88[0];
        iVar9 = (int)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
      uVar12 = 1;
      if (1 < (int)local_60) {
        uVar12 = local_60 & 0xffffffff;
      }
      uVar8 = 0;
      uVar13 = local_50 & 0xffffffff;
      do {
        pIVar3 = this->_VtxWritePtr;
        uVar1 = *(undefined8 *)((long)local_88 + (long)iVar7 * 8 + lVar5 + 0x88);
        uVar2 = *(undefined8 *)((long)local_88 + uVar8 * 8 + lVar5 + 0x88);
        fVar19 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar20 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar21 = fVar19 * fVar19 + fVar20 * fVar20;
        fVar16 = 0.5;
        if (0.5 <= fVar21) {
          fVar16 = fVar21;
        }
        fVar19 = (1.0 / fVar16) * fVar19 * 0.5;
        fVar16 = (1.0 / fVar16) * fVar20 * 0.5;
        IVar17.x = pIVar14[uVar8].x - fVar19;
        IVar17.y = pIVar14[uVar8].y - fVar16;
        pIVar3->pos = IVar17;
        pIVar3->uv = local_68;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = local_44;
        IVar18.x = pIVar14[uVar8].x + fVar19;
        IVar18.y = pIVar14[uVar8].y + fVar16;
        pIVar3[1].pos = IVar18;
        pIVar3[1].uv = local_68;
        pIVar3 = this->_VtxWritePtr;
        pIVar3[1].col = local_40;
        this->_VtxWritePtr = pIVar3 + 2;
        puVar6 = this->_IdxWritePtr;
        uVar11 = (uint)uVar13;
        *puVar6 = uVar11;
        puVar6[1] = (int)local_50 + iVar7 * 2;
        uVar10 = (int)local_78 + iVar7 * 2;
        puVar6[2] = uVar10;
        puVar6[3] = uVar10;
        puVar6[4] = uVar11 + 1;
        puVar6[5] = uVar11;
        this->_IdxWritePtr = puVar6 + 6;
        iVar7 = (int)uVar8;
        uVar8 = uVar8 + 1;
        uVar13 = (ulong)(uVar11 + 2);
        points_count = local_3c;
      } while (uVar12 != uVar8);
    }
    *local_58 = *local_58 + points_count;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}